

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.cpp
# Opt level: O2

Mat * pobr::imgProcessing::utils::matrixOps::forEachPixel
                (Mat *img,function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *operation)

{
  ulong local_30;
  ulong local_28;
  
  for (local_28 = 0; local_28 < (ulong)(long)*(int *)(img + 0xc); local_28 = local_28 + 1) {
    for (local_30 = 0; local_30 < (ulong)(long)*(int *)(img + 8); local_30 = local_30 + 1) {
      std::function<void_(const_unsigned_long_&,_const_unsigned_long_&)>::operator()
                (operation,&local_28,&local_30);
    }
  }
  return img;
}

Assistant:

const cv::Mat&
matrixOps::forEachPixel(
    const cv::Mat& img,
    const std::function<void(const uint64_t& x, const uint64_t& y)>& operation
)
{
    for (uint64_t x = 0; x < img.cols; x++) {
        for (uint64_t y = 0; y < img.rows; y++) {
            operation(x, y);
        }
    }

    return img;
}